

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateTest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  int i;
  Status stat;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar1;
  pointer pnVar2;
  int iVar3;
  long lVar4;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  pointer pnVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  long lVar9;
  byte bVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pricingTol;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar10 = 0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->thePvec->thedelta);
  pUVar1 = this->thePvec;
  leavetol(&local_b0,this);
  (this->updateViolsCo).super_IdxSet.num = 0;
  lVar9 = (long)(pUVar1->thedelta).super_IdxSet.num;
  if (0 < lVar9) {
    this_00 = &this->m_pricingViolCo;
    lVar9 = lVar9 + 1;
    do {
      i = (pUVar1->thedelta).super_IdxSet.idx[lVar9 + -2];
      stat = ((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.stat)->data[i];
      if (this->theRep * stat < 1) {
        if (this->m_pricingViolCoUpToDate == true) {
          pcVar8 = &(this->theTest).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
          pnVar6 = &local_b0;
          pcVar5 = &local_130;
          for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
            (pcVar5->data)._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
            pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
            pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar5 + (ulong)bVar10 * -8 + 4);
          }
          local_130.exp = local_b0.m_backend.exp;
          local_130.neg = local_b0.m_backend.neg;
          local_130.fpclass = local_b0.m_backend.fpclass;
          local_130.prec_elem = local_b0.m_backend.prec_elem;
          if (local_130.data._M_elems[0] != 0 || local_b0.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_130.neg = (bool)(local_b0.m_backend.neg ^ 1);
          }
          if (((local_b0.m_backend.fpclass != cpp_dec_float_NaN) &&
              (pcVar8->fpclass != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar8,&local_130), iVar3 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&this_00->m_backend,
                       &(this->theTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
          }
        }
        test((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_130,this,i,stat);
        pnVar2 = (this->theTest).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar5 = &local_130;
        pnVar7 = pnVar2 + i;
        for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pnVar7->m_backend).data._M_elems[0] = (pcVar5->data)._M_elems[0];
          pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar5 + (ulong)bVar10 * -8 + 4);
          pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar10 * -2 + 1) * 4);
        }
        pnVar2[i].m_backend.exp = local_130.exp;
        pnVar2[i].m_backend.neg = local_130.neg;
        pnVar2[i].m_backend.fpclass = local_130.fpclass;
        pnVar2[i].m_backend.prec_elem = local_130.prec_elem;
        pcVar5 = &(this->theTest).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
        if (this->sparsePricingEnterCo == true) {
          pnVar6 = &local_b0;
          pcVar8 = &local_130;
          for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
            (pcVar8->data)._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
            pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
            pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar10 * -8 + 4);
          }
          local_130.exp = local_b0.m_backend.exp;
          local_130.neg = local_b0.m_backend.neg;
          local_130.fpclass = local_b0.m_backend.fpclass;
          local_130.prec_elem = local_b0.m_backend.prec_elem;
          if (local_130.data._M_elems[0] != 0 || local_b0.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_130.neg = (bool)(local_b0.m_backend.neg ^ 1);
          }
          if (((local_b0.m_backend.fpclass == cpp_dec_float_NaN) ||
              (pcVar5->fpclass == cpp_dec_float_NaN)) ||
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar5,&local_130), -1 < iVar3)) {
            (this->isInfeasibleCo).data[i] = 0;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       &(this->theTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
            if ((this->isInfeasibleCo).data[i] == 0) {
              DIdxSet::addIdx(&this->infeasibilitiesCo,i);
              (this->isInfeasibleCo).data[i] = 1;
            }
            if (this->hyperPricingEnter == true) {
              DIdxSet::addIdx(&this->updateViolsCo,i);
            }
          }
        }
        else {
          pnVar6 = &local_b0;
          pcVar8 = &local_130;
          for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
            (pcVar8->data)._M_elems[0] = (pnVar6->m_backend).data._M_elems[0];
            pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar6 + ((ulong)bVar10 * -2 + 1) * 4);
            pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar10 * -8 + 4);
          }
          local_130.exp = local_b0.m_backend.exp;
          local_130.neg = local_b0.m_backend.neg;
          local_130.fpclass = local_b0.m_backend.fpclass;
          local_130.prec_elem = local_b0.m_backend.prec_elem;
          if (local_130.data._M_elems[0] != 0 || local_b0.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_130.neg = (bool)(local_b0.m_backend.neg ^ 1);
          }
          if (((local_b0.m_backend.fpclass != cpp_dec_float_NaN) &&
              (pcVar5->fpclass != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (pcVar5,&local_130), iVar3 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&this_00->m_backend,
                       &(this->theTest).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
          }
        }
      }
      else {
        (this->isInfeasibleCo).data[i] = 0;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&(this->theTest).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[i].m_backend,0);
      }
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateTest()
{
   thePvec->delta().setup();

   const IdxSet& idx = thePvec->idx();
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();

   int i;
   updateViolsCo.clear();

   for(i = idx.size() - 1; i >= 0; --i)
   {
      int j = idx.index(i);
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(j);

      if(!isBasic(stat))
      {
         if(m_pricingViolCoUpToDate && theTest[j] < -pricingTol)
            m_pricingViolCo += theTest[j];

         theTest[j] = test(j, stat);

         if(sparsePricingEnterCo)
         {
            if(theTest[j] < -pricingTol)
            {
               assert(remainingRoundsEnterCo == 0);
               m_pricingViolCo -= theTest[j];

               if(isInfeasibleCo[j] == SPxPricer<R>::NOT_VIOLATED)
               {
                  infeasibilitiesCo.addIdx(j);
                  isInfeasibleCo[j] = SPxPricer<R>::VIOLATED;
               }

               if(hyperPricingEnter)
                  updateViolsCo.addIdx(j);
            }
            else
            {
               isInfeasibleCo[j] = SPxPricer<R>::NOT_VIOLATED;
            }
         }
         else if(theTest[j] < -pricingTol)
            m_pricingViolCo -= theTest[j];
      }
      else
      {
         isInfeasibleCo[j] = SPxPricer<R>::NOT_VIOLATED;
         theTest[j] = 0;
      }
   }
}